

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void metal_texld(Context *ctx,int texldd)

{
  uint uVar1;
  int iVar2;
  RegisterList *pRVar3;
  uint local_3bc;
  char local_3b8 [8];
  char code_1 [128];
  char local_32e [6];
  char local_328 [2];
  char swiz_str [6];
  char proj [64];
  char *local_2e0;
  char *projop;
  char bias [64];
  char *local_290;
  char *biasright;
  char *biasleft;
  char *grad;
  char src3 [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char *funcname;
  RegisterList *sreg_1;
  SourceArgInfo *samp_arg;
  char swizzle [4];
  TextureType ttype;
  RegisterList *sreg;
  char code [128];
  char sampler [64];
  char dst [64];
  DestArgInfo *info;
  int texldd_local;
  Context *ctx_local;
  
  ctx->metal_need_header_texture = 1;
  iVar2 = shader_version_atleast(ctx,'\x01','\x04');
  if (iVar2 == 0) {
    memset(&sreg,0,0x80);
    if (texldd != 0) {
      __assert_fail("!texldd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x164e,"void metal_texld(Context *, const int)");
    }
    _swizzle = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum);
    if (_swizzle == (RegisterList *)0x0) {
      local_3bc = 0;
    }
    else {
      local_3bc = _swizzle->index;
    }
    samp_arg._4_4_ = local_3bc;
    samp_arg._0_4_ = 0x7a7978;
    if (local_3bc == 2) {
      samp_arg._0_4_ = 0x7978;
    }
    get_METAL_destarg_varname(ctx,sampler + 0x38,0x40);
    get_METAL_varname_in_buf(ctx,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum,code + 0x78,0x40);
    make_METAL_destarg_assign
              (ctx,(char *)&sreg,0x80,"%s_texture.sample(%s, %s.%s)",code + 0x78,code + 0x78,
               sampler + 0x38,&samp_arg);
    output_line(ctx,"%s",&sreg);
  }
  else {
    iVar2 = shader_version_atleast(ctx,'\x02','\0');
    if (iVar2 == 0) {
      fail(ctx,"TEXLD == Shader Model 1.4 unimplemented.");
    }
    else {
      pRVar3 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,ctx->source_args[1].regnum);
      memset(src1 + 0x38,0,0x40);
      get_METAL_srcarg_varname(ctx,1,src2 + 0x38,0x40);
      memset(src3 + 0x38,0,0x40);
      memset(&grad,0,0x40);
      if (pRVar3 == (RegisterList *)0x0) {
        fail(ctx,"TEXLD using undeclared sampler");
      }
      else {
        biasleft = "";
        if (texldd != 0) {
          uVar1 = pRVar3->index;
          if (uVar1 == 2) {
            biasleft = "2d";
            make_METAL_srcarg_string_vec2(ctx,2,src3 + 0x38,0x40);
            make_METAL_srcarg_string_vec2(ctx,3,(char *)&grad,0x40);
          }
          else if (uVar1 == 3) {
            biasleft = "cube";
            make_METAL_srcarg_string_vec3(ctx,2,src3 + 0x38,0x40);
            make_METAL_srcarg_string_vec3(ctx,3,(char *)&grad,0x40);
          }
          else if (uVar1 == 4) {
            biasleft = "3d";
            make_METAL_srcarg_string_vec3(ctx,2,src3 + 0x38,0x40);
            make_METAL_srcarg_string_vec3(ctx,3,(char *)&grad,0x40);
          }
        }
        biasright = "";
        local_290 = "";
        memset(&projop,0,0x40);
        if (ctx->instruction_controls == 2) {
          biasright = ", bias(";
          make_METAL_srcarg_string_w(ctx,0,(char *)&projop,0x40);
          local_290 = ")";
        }
        local_2e0 = "";
        memset(local_328,0,0x40);
        if (ctx->instruction_controls == 1) {
          if (pRVar3->index == 3) {
            fail(ctx,"TEXLDP on a cubemap");
          }
          local_2e0 = " / ";
          make_METAL_srcarg_string_w(ctx,0,local_328,0x40);
        }
        if (pRVar3->index == 2) {
          make_METAL_srcarg_string_vec2(ctx,0,src1 + 0x38,0x40);
        }
        else {
          if (1 < pRVar3->index - 3) {
            fail(ctx,"unknown texture type");
            return;
          }
          make_METAL_srcarg_string_vec3(ctx,0,src1 + 0x38,0x40);
        }
        iVar2 = isscalar(ctx,ctx->shader_type,ctx->source_args[1].regtype,ctx->source_args[1].regnum
                        );
        if (iVar2 != 0) {
          __assert_fail("!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                        ,0x16ba,"void metal_texld(Context *, const int)");
        }
        memset(local_32e,0,6);
        make_METAL_swizzle_string(local_32e,6,ctx->source_args[1].swizzle,(ctx->dest_arg).writemask)
        ;
        if (texldd == 0) {
          make_METAL_destarg_assign
                    (ctx,local_3b8,0x80,"%s_texture.sample(%s, %s%s%s%s%s%s)%s",src2 + 0x38,
                     src2 + 0x38,src1 + 0x38,local_2e0,local_328,biasright,&projop,local_290,
                     local_32e);
        }
        else {
          make_METAL_destarg_assign
                    (ctx,local_3b8,0x80,"%s_texture.sample(%s, %s, gradient%s(%s, %s))%s",
                     src2 + 0x38,src2 + 0x38,src1 + 0x38,biasleft,src3 + 0x38,&grad,local_32e);
        }
        output_line(ctx,"%s",local_3b8);
      }
    }
  }
  return;
}

Assistant:

static void metal_texld(Context *ctx, const int texldd)
{
    ctx->metal_need_header_texture = 1;
    if (!shader_version_atleast(ctx, 1, 4))
    {
        DestArgInfo *info = &ctx->dest_arg;
        char dst[64];
        char sampler[64];
        char code[128] = {0};

        assert(!texldd);

        RegisterList *sreg;
        sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, info->regnum);
        const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

        char swizzle[4] = { 'x', 'y', 'z', '\0' };
        if (ttype == TEXTURE_TYPE_2D)
            swizzle[2] = '\0';  // "xy" instead of "xyz".

        // !!! FIXME: this code counts on the register not having swizzles, etc.
        get_METAL_destarg_varname(ctx, dst, sizeof (dst));
        get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                                 sampler, sizeof (sampler));

        make_METAL_destarg_assign(ctx, code, sizeof (code),
                                  "%s_texture.sample(%s, %s.%s)",
                                  sampler, sampler, dst, swizzle);
        output_line(ctx, "%s", code);
    } // if

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        // ps_1_4 is different, too!
        fail(ctx, "TEXLD == Shader Model 1.4 unimplemented.");  // !!! FIXME
        return;
    } // else if

    else
    {
        const SourceArgInfo *samp_arg = &ctx->source_args[1];
        RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                          samp_arg->regnum);
        const char *funcname = NULL;
        char src0[64] = { '\0' };
        char src1[64]; get_METAL_srcarg_varname(ctx, 1, src1, sizeof (src1)); // !!! FIXME: SRC_MOD?
        char src2[64] = { '\0' };
        char src3[64] = { '\0' };

        if (sreg == NULL)
        {
            fail(ctx, "TEXLD using undeclared sampler");
            return;
        } // if

        const char *grad = "";
        if (texldd)
        {
            switch ((const TextureType) sreg->index)
            {
                case TEXTURE_TYPE_2D:
                    grad = "2d";
                    make_METAL_srcarg_string_vec2(ctx, 2, src2, sizeof (src2));
                    make_METAL_srcarg_string_vec2(ctx, 3, src3, sizeof (src3));
                    break;
                case TEXTURE_TYPE_VOLUME:
                    grad = "3d";
                    make_METAL_srcarg_string_vec3(ctx, 2, src2, sizeof (src2));
                    make_METAL_srcarg_string_vec3(ctx, 3, src3, sizeof (src3));
                    break;
                case TEXTURE_TYPE_CUBE:
                    grad = "cube";
                    make_METAL_srcarg_string_vec3(ctx, 2, src2, sizeof (src2));
                    make_METAL_srcarg_string_vec3(ctx, 3, src3, sizeof (src3));
                    break;
            } // switch
        } // if

        // !!! FIXME: can TEXLDD set instruction_controls?
        // !!! FIXME: does the d3d bias value map directly to Metal?
        const char *biasleft = "";
        const char *biasright = "";
        char bias[64] = { '\0' };
        if (ctx->instruction_controls == CONTROL_TEXLDB)
        {
            biasleft = ", bias(";
            make_METAL_srcarg_string_w(ctx, 0, bias, sizeof (bias));
            biasright = ")";
        } // if

        // Metal doesn't have a texture2DProj() function, but you just divide
        // your texcoords by texcoords.w to achieve it anyhow, so DIY.
        const char *projop = "";
        char proj[64] = { '\0' };
        if (ctx->instruction_controls == CONTROL_TEXLDP)
        {
            if (sreg->index == TEXTURE_TYPE_CUBE)
                fail(ctx, "TEXLDP on a cubemap");  // !!! FIXME: is this legal?
            projop = " / ";
            make_METAL_srcarg_string_w(ctx, 0, proj, sizeof (proj));
        } // if

        switch ((const TextureType) sreg->index)
        {
            case TEXTURE_TYPE_2D:
                make_METAL_srcarg_string_vec2(ctx, 0, src0, sizeof (src0));
                break;

            case TEXTURE_TYPE_CUBE:
            case TEXTURE_TYPE_VOLUME:
                make_METAL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
                break;

            default:
                fail(ctx, "unknown texture type");
                return;
        } // switch

        assert(!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum));
        char swiz_str[6] = { '\0' };
        make_METAL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 samp_arg->swizzle, ctx->dest_arg.writemask);

        char code[128];
        if (texldd)
        {
            make_METAL_destarg_assign(ctx, code, sizeof (code),
                                     "%s_texture.sample(%s, %s, gradient%s(%s, %s))%s",
                                     src1, src1, src0, grad, src2, src3, swiz_str);
        } // if
        else
        {
            make_METAL_destarg_assign(ctx, code, sizeof (code),
                                     "%s_texture.sample(%s, %s%s%s%s%s%s)%s",
                                     src1, src1, src0, projop, proj,
                                     biasleft, bias, biasright, swiz_str);
        } // else

        output_line(ctx, "%s", code);
    } // else
}